

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::Option::run_callback(Option *this)

{
  bool bVar1;
  ConversionError *this_00;
  results_t *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_58;
  string local_40;
  
  if (this->current_option_state_ == parsing) {
    _validate_results(this,&this->results_);
    this->current_option_state_ = validated;
  }
  else if (3 < (int)this->current_option_state_) goto LAB_0011b479;
  _reduce_results(this,&this->proc_results_,&this->results_);
  this->current_option_state_ = reduced;
LAB_0011b479:
  this->current_option_state_ = callback_run;
  if ((this->callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    __args = &this->proc_results_;
    if ((this->proc_results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->proc_results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __args = &this->results_;
    }
    bVar1 = std::
            function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
            ::operator()(&this->callback_,__args);
    if (!bVar1) {
      this_00 = (ConversionError *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_40,this,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&vStack_58,&this->results_);
      ConversionError::ConversionError(this_00,&local_40,&vStack_58);
      __cxa_throw(this_00,&ConversionError::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void run_callback() {

        if(current_option_state_ == option_state::parsing) {
            _validate_results(results_);
            current_option_state_ = option_state::validated;
        }

        if(current_option_state_ < option_state::reduced) {
            _reduce_results(proc_results_, results_);
            current_option_state_ = option_state::reduced;
        }
        if(current_option_state_ >= option_state::reduced) {
            current_option_state_ = option_state::callback_run;
            if(!(callback_)) {
                return;
            }
            const results_t &send_results = proc_results_.empty() ? results_ : proc_results_;
            bool local_result = callback_(send_results);

            if(!local_result)
                throw ConversionError(get_name(), results_);
        }
    }